

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonArrayFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  Mem *pMVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  JsonString jx;
  JsonString local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_c0,0xaa,0x88);
  local_c0.zBuf = local_c0.zSpace;
  local_c0.nAlloc = 100;
  local_c0.bStatic = '\x01';
  local_c0.eErr = '\0';
  local_c0.nUsed = 1;
  local_c0.zSpace[0] = '[';
  local_c0.pCtx = ctx;
  if (0 < argc) {
    uVar3 = 0;
    do {
      jsonAppendSeparator(&local_c0);
      jsonAppendSqlValue(&local_c0,argv[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  if (local_c0.nUsed < local_c0.nAlloc) {
    local_c0.zBuf[local_c0.nUsed] = ']';
    local_c0.nUsed = local_c0.nUsed + 1;
  }
  else {
    jsonAppendCharExpand(&local_c0,']');
  }
  jsonReturnString(&local_c0,(JsonParse *)0x0,(sqlite3_context *)0x0);
  pMVar2 = ctx->pOut;
  pMVar2->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar2->flags + 1);
  *pbVar1 = *pbVar1 | 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonArrayFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;

  jsonStringInit(&jx, ctx);
  jsonAppendChar(&jx, '[');
  for(i=0; i<argc; i++){
    jsonAppendSeparator(&jx);
    jsonAppendSqlValue(&jx, argv[i]);
  }
  jsonAppendChar(&jx, ']');
  jsonReturnString(&jx, 0, 0);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}